

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

Var * __thiscall
Js::InlinedFrameWalker::GetArgv(InlinedFrameWalker *this,bool includeThis,bool boxArgsAndDeepCopy)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  InlinedFrame *pIVar4;
  undefined4 *puVar5;
  size_t sVar6;
  Recycler *this_00;
  ulong uVar7;
  InlineeCallInfo *args;
  ulong uVar8;
  ulong argCount;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  pIVar4 = GetFrameAtIndex(this,this->currentIndex);
  if (pIVar4 == (InlinedFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x567,"(currentFrame)","currentFrame");
    if (!bVar2) goto LAB_00aecc4e;
    *puVar5 = 0;
  }
  sVar6 = GetArgc(this);
  uVar8 = (ulong)!includeThis;
  if (boxArgsAndDeepCopy) {
    argCount = sVar6 - uVar8;
    local_68 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4f68a62;
    data.filename._0_4_ = 0x572;
    data.plusSize = argCount;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((((((this->parentFunction->super_ScriptFunctionBase).
                              super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                              type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                          scriptContext.ptr)->recycler,(TrackAllocData *)local_68);
    if ((uint)sVar6 == (uint)!includeThis) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      args = (InlineeCallInfo *)&DAT_00000008;
    }
    else {
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        data._32_8_ = __tls_get_addr(&PTR_01548f08);
        *(undefined4 *)data._32_8_ = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00aecc4e;
        *(undefined4 *)data._32_8_ = 0;
      }
      args = (InlineeCallInfo *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (this_00,-(ulong)(argCount >> 0x3d != 0) | argCount * 8);
      if (args == (InlineeCallInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00aecc4e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      uVar7 = 0;
      do {
        args[uVar7] = (&pIVar4[1].super_InlinedFrameLayout.callInfo)[uVar8 + uVar7];
        uVar7 = uVar7 + 1;
      } while (argCount != uVar7);
    }
    FinalizeStackValues(this,(Var *)args,argCount,true);
  }
  else {
    args = &pIVar4[1].super_InlinedFrameLayout.callInfo + uVar8;
  }
  return (Var *)args;
}

Assistant:

Js::Var *InlinedFrameWalker::GetArgv(bool includeThis, bool boxArgsAndDeepCopy) const
    {
        InlinedFrameWalker::InlinedFrame *const currentFrame = GetCurrentFrame();
        Assert(currentFrame);

        uint firstArg = includeThis ? InlinedFrameArgIndex_This : InlinedFrameArgIndex_SecondScriptArg;
        size_t argCount = this->GetArgc() - firstArg;
        Js::Var *args;
        if (!boxArgsAndDeepCopy)
        {
            args = &currentFrame->argv[firstArg];
        }
        else
        {
            args = RecyclerNewArray(parentFunction->GetScriptContext()->GetRecycler(), Js::Var, argCount);
            for (size_t i = 0; i < argCount; i++)
            {
                args[i] = currentFrame->argv[firstArg + i];
            }

            this->FinalizeStackValues(args, argCount, true /*deepCopy*/);
        }

        return args;
    }